

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

int Assimp::FBX::ParseTokenAsInt(Token *t,char **err_out)

{
  int iVar1;
  char *pcVar2;
  char *out;
  char *local_20;
  
  *err_out = (char *)0x0;
  if (t->type == TokenType_DATA) {
    if (t->column == 0xffffffff) {
      if (*t->sbegin == 'I') {
        return *(int *)(t->sbegin + 1);
      }
      pcVar2 = "failed to parse I(nt), unexpected data type (binary)";
    }
    else {
      iVar1 = strtol10(t->sbegin,&local_20);
      if (local_20 == t->send) {
        return iVar1;
      }
      pcVar2 = "failed to parse ID";
    }
  }
  else {
    pcVar2 = "expected TOK_DATA token";
  }
  *err_out = pcVar2;
  return 0;
}

Assistant:

int ParseTokenAsInt(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'I') {
            err_out = "failed to parse I(nt), unexpected data type (binary)";
            return 0;
        }

        BE_NCONST int32_t ival = SafeParse<int32_t>(data+1, t.end());
        AI_SWAP4(ival);
        return static_cast<int>(ival);
    }

    ai_assert(static_cast<size_t>(t.end() - t.begin()) > 0);

    const char* out;
    const int intval = strtol10(t.begin(),&out);
    if (out != t.end()) {
        err_out = "failed to parse ID";
        return 0;
    }

    return intval;
}